

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O0

char * escape_string(Curl_easy *data,char *src,mimestrategy strategy)

{
  char *pcVar1;
  bool bVar2;
  char **local_50;
  char **p;
  char **table;
  dynbuf db;
  CURLcode result;
  mimestrategy strategy_local;
  char *src_local;
  Curl_easy *data_local;
  
  p = escape_string::formtable;
  if ((strategy == MIMESTRATEGY_MAIL) ||
     ((data != (Curl_easy *)0x0 && (((data->set).mime_options & 1) != 0)))) {
    p = escape_string::mimetable;
  }
  db.toobig._4_4_ = strategy;
  Curl_dyn_init((dynbuf *)&table,8000000);
  db.toobig._0_4_ = Curl_dyn_addn((dynbuf *)&table,"",0);
  _result = src;
  while( true ) {
    bVar2 = false;
    if ((CURLcode)db.toobig == CURLE_OK) {
      bVar2 = *_result != '\0';
    }
    if (!bVar2) break;
    local_50 = p;
    while( true ) {
      bVar2 = false;
      if (*local_50 != (char *)0x0) {
        bVar2 = **local_50 != *_result;
      }
      if (!bVar2) break;
      local_50 = local_50 + 1;
    }
    if (*local_50 == (char *)0x0) {
      db.toobig._0_4_ = Curl_dyn_addn((dynbuf *)&table,_result,1);
    }
    else {
      db.toobig._0_4_ = Curl_dyn_add((dynbuf *)&table,*local_50 + 1);
    }
    _result = _result + 1;
  }
  pcVar1 = Curl_dyn_ptr((dynbuf *)&table);
  return pcVar1;
}

Assistant:

static char *escape_string(struct Curl_easy *data,
                           const char *src, enum mimestrategy strategy)
{
  CURLcode result;
  struct dynbuf db;
  const char * const *table;
  const char * const *p;
  /* replace first character by rest of string. */
  static const char * const mimetable[] = {
    "\\\\\\",
    "\"\\\"",
    NULL
  };
  /* WHATWG HTML living standard 4.10.21.8 2 specifies:
     For field names and filenames for file fields, the result of the
     encoding in the previous bullet point must be escaped by replacing
     any 0x0A (LF) bytes with the byte sequence `%0A`, 0x0D (CR) with `%0D`
     and 0x22 (") with `%22`.
     The user agent must not perform any other escapes. */
  static const char * const formtable[] = {
    "\"%22",
    "\r%0D",
    "\n%0A",
    NULL
  };

  table = formtable;
  /* data can be NULL when this function is called indirectly from
     curl_formget(). */
  if(strategy == MIMESTRATEGY_MAIL ||
     (data && (data->set.mime_options & CURLMIMEOPT_FORMESCAPE)))
    table = mimetable;

  Curl_dyn_init(&db, CURL_MAX_INPUT_LENGTH);

  for(result = Curl_dyn_addn(&db, STRCONST("")); !result && *src; src++) {
    for(p = table; *p && **p != *src; p++)
      ;

    if(*p)
      result = Curl_dyn_add(&db, *p + 1);
    else
      result = Curl_dyn_addn(&db, src, 1);
  }

  return Curl_dyn_ptr(&db);
}